

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void speech_prog_ruins_mouth(CHAR_DATA *mob,CHAR_DATA *ch,char *speech)

{
  char *pcVar1;
  CHAR_DATA *in_RDX;
  char *in_RSI;
  ROOM_INDEX_DATA *to_room;
  CHAR_DATA *in_stack_00000030;
  char *in_stack_00005c30;
  CHAR_DATA *in_stack_00005c38;
  void *in_stack_ffffffffffffffd8;
  ROOM_INDEX_DATA *arg1;
  
  arg1 = (ROOM_INDEX_DATA *)0x0;
  pcVar1 = strstr((char *)in_RDX,"testing");
  if ((pcVar1 == (char *)0x0) && (pcVar1 = strstr((char *)in_RDX,"Testing"), pcVar1 == (char *)0x0))
  {
    pcVar1 = strstr((char *)in_RDX,"office");
    if ((pcVar1 == (char *)0x0) && (pcVar1 = strstr((char *)in_RDX,"Office"), pcVar1 == (char *)0x0)
       ) {
      pcVar1 = strstr((char *)in_RDX,"inventory");
      if ((pcVar1 != (char *)0x0) ||
         (pcVar1 = strstr((char *)in_RDX,"Inventory"), pcVar1 != (char *)0x0)) {
        arg1 = get_room_index((int)((ulong)in_RDX >> 0x20));
      }
    }
    else {
      arg1 = get_room_index((int)((ulong)in_RDX >> 0x20));
    }
  }
  else {
    arg1 = get_room_index((int)((ulong)in_RDX >> 0x20));
  }
  if (arg1 != (ROOM_INDEX_DATA *)0x0) {
    send_to_char(in_RSI,in_RDX);
    act(in_RSI,in_RDX,arg1,in_stack_ffffffffffffffd8,0);
    char_from_room(in_stack_00000030);
    char_to_room((CHAR_DATA *)speech,to_room);
    do_look(in_stack_00005c38,in_stack_00005c30);
  }
  return;
}

Assistant:

void speech_prog_ruins_mouth(CHAR_DATA *mob, CHAR_DATA *ch, char *speech)
{
	ROOM_INDEX_DATA *to_room = nullptr;

	if (strstr(speech, "testing") || strstr(speech, "Testing"))
		to_room = get_room_index(20159);
	else if (strstr(speech, "office") || strstr(speech, "Office"))
		to_room = get_room_index(20158);
	else if (strstr(speech, "inventory") || strstr(speech, "Inventory"))
		to_room = get_room_index(20161);

	if (!to_room)
		return;

	send_to_char("A magic mouth impossibly beckons for you to follow and strange magicks force you through the shimmering portal.\n\r", ch);
	act("The magic mouth impossibly beckons for $n to follow and $e vanishes into the portal.", ch, 0, 0, TO_ROOM);

	char_from_room(ch);
	char_to_room(ch, to_room);
	do_look(ch, "auto");
}